

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O1

ref<immutable::rrb<char,_false,_6>_> __thiscall
immutable::rrb_details::rrb_drop_left<char,false,6>
          (rrb_details *this,ref<immutable::rrb<char,_false,_6>_> *in,uint32_t left)

{
  uint32_t uVar1;
  rrb<char,_false,_6> *prVar2;
  leaf_node<char,_false> *plVar3;
  tree_node<char,_false> *ptVar4;
  rrb<char,_false,_6> *temp_2;
  rrb<char,_false,_6> *prVar5;
  undefined8 *puVar6;
  uint *puVar7;
  ulong uVar8;
  ref<immutable::rrb<char,_false,_6>_> rVar9;
  long lVar10;
  ulong uVar11;
  char *__function;
  uint32_t uVar12;
  uint uVar13;
  uint uVar14;
  ref<immutable::rrb<char,_false,_6>_> new_rrb;
  ref<immutable::rrb_details::tree_node<char,_false>_> temp;
  ref<immutable::rrb<char,_false,_6>_> local_58;
  ref<immutable::rrb<char,_false,_6>_> local_50;
  uint local_44;
  rrb<char,_false,_6> *local_40;
  ref<immutable::rrb_details::tree_node<char,_false>_> local_38;
  
  prVar5 = in->ptr;
  if (prVar5 != (rrb<char,_false,_6> *)0x0) {
    uVar14 = prVar5->cnt;
    uVar13 = uVar14 - left;
    if (uVar14 < left || uVar13 == 0) {
      puVar6 = (undefined8 *)malloc(0x28);
      *puVar6 = 0;
      *(undefined4 *)(puVar6 + 1) = 0;
      puVar6[2] = 0;
      puVar6[3] = 0;
      local_50.ptr = (rrb<char,_false,_6> *)malloc(0x18);
      (local_50.ptr)->cnt = 0;
      (local_50.ptr)->shift = 0;
      ((local_50.ptr)->tail).ptr = (leaf_node<char,_false> *)0x0;
      *(undefined4 *)&(local_50.ptr)->field_0xc = 0;
      (local_50.ptr)->tail_len = 1;
      ref<immutable::rrb_details::leaf_node<char,_false>_>::operator=
                ((ref<immutable::rrb_details::leaf_node<char,_false>_> *)(puVar6 + 2),
                 (ref<immutable::rrb_details::leaf_node<char,_false>_> *)&local_50);
      if ((local_50.ptr != (rrb<char,_false,_6> *)0x0) &&
         (uVar1 = (local_50.ptr)->tail_len, (local_50.ptr)->tail_len = uVar1 - 1, uVar1 == 1)) {
        free(local_50.ptr);
      }
      *(undefined8 **)this = puVar6;
      *(undefined4 *)(puVar6 + 4) = 1;
      return (ref<immutable::rrb<char,_false,_6>_>)(rrb<char,_false,_6> *)this;
    }
    if (left != 0) {
      local_44 = prVar5->tail_len;
      if (local_44 < uVar13) {
        local_40 = (rrb<char,_false,_6> *)this;
        prVar5 = (rrb<char,_false,_6> *)malloc(0x28);
        prVar5->cnt = 0;
        prVar5->shift = 0;
        prVar5->tail_len = 0;
        (prVar5->tail).ptr = (leaf_node<char,_false> *)0x0;
        (prVar5->root).ptr = (tree_node<char,_false> *)0x0;
        local_50.ptr = (rrb<char,_false,_6> *)malloc(0x18);
        (local_50.ptr)->cnt = 0;
        (local_50.ptr)->shift = 0;
        ((local_50.ptr)->tail).ptr = (leaf_node<char,_false> *)0x0;
        *(undefined4 *)&(local_50.ptr)->field_0xc = 0;
        (local_50.ptr)->tail_len = 1;
        ref<immutable::rrb_details::leaf_node<char,_false>_>::operator=
                  (&prVar5->tail,(ref<immutable::rrb_details::leaf_node<char,_false>_> *)&local_50);
        if ((local_50.ptr != (rrb<char,_false,_6> *)0x0) &&
           (uVar1 = (local_50.ptr)->tail_len, (local_50.ptr)->tail_len = uVar1 - 1, uVar1 == 1)) {
          free(local_50.ptr);
        }
        this = (rrb_details *)local_40;
        prVar5->_ref_count = 1;
        prVar2 = in->ptr;
        local_58.ptr = prVar5;
        if (prVar2 != (rrb<char,_false,_6> *)0x0) {
          rrb_drop_left_rec<char,false,6>
                    ((rrb_details *)&local_50,&prVar5->shift,&prVar2->root,left,prVar2->shift,false)
          ;
          rVar9.ptr = local_50.ptr;
          if (local_50.ptr != (rrb<char,_false,_6> *)0x0) {
            (local_50.ptr)->tail_len = (local_50.ptr)->tail_len + 1;
          }
          ref<immutable::rrb_details::tree_node<char,_false>_>::~ref
                    ((ref<immutable::rrb_details::tree_node<char,_false>_> *)&local_50);
          if (local_58.ptr != (rrb<char,_false,_6> *)0x0) {
            (local_58.ptr)->cnt = uVar13;
            if (rVar9.ptr != (rrb<char,_false,_6> *)0x0) {
              (rVar9.ptr)->tail_len = (rVar9.ptr)->tail_len + 1;
            }
            local_50.ptr = (rrb<char,_false,_6> *)((local_58.ptr)->root).ptr;
            ((local_58.ptr)->root).ptr = (tree_node<char,_false> *)rVar9.ptr;
            ref<immutable::rrb_details::tree_node<char,_false>_>::~ref
                      ((ref<immutable::rrb_details::tree_node<char,_false>_> *)&local_50);
            if (local_58.ptr != (rrb<char,_false,_6> *)0x0) {
              if ((local_58.ptr)->shift != 0) {
                if (rVar9.ptr == (rrb<char,_false,_6> *)0x0) {
                  __function = 
                  "T *immutable::ref<immutable::rrb_details::internal_node<char, false>>::operator->() const [T = immutable::rrb_details::internal_node<char, false>]"
                  ;
                  goto LAB_00155add;
                }
                plVar3 = ((rVar9.ptr)->tail).ptr;
                if (plVar3 != (leaf_node<char,_false> *)0x0) {
                  if (in->ptr == (rrb<char,_false,_6> *)0x0) goto LAB_00155a27;
                  *(uint32_t *)(*(long *)plVar3 + (ulong)((rVar9.ptr)->shift - 1) * 4) =
                       (local_58.ptr)->cnt - in->ptr->tail_len;
                }
              }
              if (in->ptr != (rrb<char,_false,_6> *)0x0) {
                ref<immutable::rrb_details::leaf_node<char,_false>_>::operator=
                          (&(local_58.ptr)->tail,&in->ptr->tail);
                prVar5 = in->ptr;
                if ((prVar5 != (rrb<char,_false,_6> *)0x0) &&
                   (local_58.ptr != (rrb<char,_false,_6> *)0x0)) {
                  (local_58.ptr)->tail_len = prVar5->tail_len;
                  (local_58.ptr)->_ref_count = (local_58.ptr)->_ref_count + 1;
                  in->ptr = (rrb<char,_false,_6> *)local_58;
                  local_50.ptr = prVar5;
                  ref<immutable::rrb<char,_false,_6>_>::~ref(&local_50);
                  release<char>((internal_node<char,_false> *)rVar9.ptr);
                  ref<immutable::rrb<char,_false,_6>_>::~ref(&local_58);
                  uVar14 = local_44;
                  goto LAB_001556e7;
                }
              }
            }
          }
        }
        goto LAB_00155a27;
      }
      uVar8 = (ulong)uVar13;
      local_58.ptr = (rrb<char,_false,_6> *)malloc(uVar8 + 0x18);
      (local_58.ptr)->shift = uVar13;
      (local_58.ptr)->cnt = 0;
      ((local_58.ptr)->tail).ptr = (leaf_node<char,_false> *)&(local_58.ptr)->root;
      *(undefined4 *)&(local_58.ptr)->field_0xc = 0;
      if (uVar14 != left) {
        uVar11 = 0;
        do {
          *(undefined1 *)((long)&(((local_58.ptr)->tail).ptr)->type + uVar11) = 0;
          uVar11 = uVar11 + 1;
        } while (uVar8 != uVar11);
      }
      (local_58.ptr)->tail_len = 1;
      if (uVar14 != left) {
        uVar11 = 0;
        do {
          prVar5 = in->ptr;
          if (prVar5 == (rrb<char,_false,_6> *)0x0) goto LAB_00155a27;
          plVar3 = (prVar5->tail).ptr;
          if ((plVar3 == (leaf_node<char,_false> *)0x0) ||
             (local_58.ptr == (rrb<char,_false,_6> *)0x0)) goto LAB_00155ab1;
          *(char *)((long)&(((local_58.ptr)->tail).ptr)->type + uVar11) =
               plVar3->child[(left - uVar14) + (int)uVar11 + prVar5->tail_len];
          uVar11 = uVar11 + 1;
        } while (uVar8 != uVar11);
      }
      puVar7 = (uint *)malloc(0x28);
      puVar7[0] = 0;
      puVar7[1] = 0;
      puVar7[2] = 0;
      puVar7[4] = 0;
      puVar7[5] = 0;
      puVar7[6] = 0;
      puVar7[7] = 0;
      local_50.ptr = (rrb<char,_false,_6> *)malloc(0x18);
      (local_50.ptr)->cnt = 0;
      (local_50.ptr)->shift = 0;
      ((local_50.ptr)->tail).ptr = (leaf_node<char,_false> *)0x0;
      *(undefined4 *)&(local_50.ptr)->field_0xc = 0;
      (local_50.ptr)->tail_len = 1;
      ref<immutable::rrb_details::leaf_node<char,_false>_>::operator=
                ((ref<immutable::rrb_details::leaf_node<char,_false>_> *)(puVar7 + 4),
                 (ref<immutable::rrb_details::leaf_node<char,_false>_> *)&local_50);
      if ((local_50.ptr != (rrb<char,_false,_6> *)0x0) &&
         (uVar1 = (local_50.ptr)->tail_len, (local_50.ptr)->tail_len = uVar1 - 1, uVar1 == 1)) {
        free(local_50.ptr);
      }
      *(uint **)this = puVar7;
      puVar7[8] = 1;
      *puVar7 = uVar13;
      puVar7[2] = uVar13;
      ref<immutable::rrb_details::leaf_node<char,_false>_>::operator=
                ((ref<immutable::rrb_details::leaf_node<char,_false>_> *)(puVar7 + 4),
                 (ref<immutable::rrb_details::leaf_node<char,_false>_> *)&local_58);
      uVar14 = local_44;
      if ((local_58.ptr != (rrb<char,_false,_6> *)0x0) &&
         (uVar1 = (local_58.ptr)->tail_len, (local_58.ptr)->tail_len = uVar1 - 1, uVar1 == 1)) {
        free(local_58.ptr);
      }
LAB_001556e7:
      if (uVar13 <= uVar14) {
        return (ref<immutable::rrb<char,_false,_6>_>)(rrb<char,_false,_6> *)this;
      }
    }
    prVar5 = in->ptr;
    if (prVar5 != (rrb<char,_false,_6> *)0x0) {
      if ((prVar5->shift != 0) ||
         (ptVar4 = (prVar5->root).ptr, ptVar4 == (tree_node<char,_false> *)0x0)) {
LAB_001556fe:
        prVar5 = in->ptr;
        *(rrb<char,_false,_6> **)this = prVar5;
        if (prVar5 != (rrb<char,_false,_6> *)0x0) {
          prVar5->_ref_count = prVar5->_ref_count + 1;
        }
        return (ref<immutable::rrb<char,_false,_6>_>)(rrb<char,_false,_6> *)this;
      }
      if (prVar5->cnt < 0x41) {
        uVar14 = prVar5->cnt;
        uVar8 = (ulong)uVar14;
        local_58.ptr = (rrb<char,_false,_6> *)malloc(uVar8 + 0x18);
        (local_58.ptr)->shift = uVar14;
        (local_58.ptr)->cnt = 0;
        ((local_58.ptr)->tail).ptr = (leaf_node<char,_false> *)&(local_58.ptr)->root;
        *(undefined4 *)&(local_58.ptr)->field_0xc = 0;
        if (uVar8 != 0) {
          uVar11 = 0;
          do {
            *(undefined1 *)((long)&(((local_58.ptr)->tail).ptr)->type + uVar11) = 0;
            uVar11 = uVar11 + 1;
          } while (uVar8 != uVar11);
        }
        (local_58.ptr)->tail_len = 1;
        prVar5 = in->ptr;
        if (prVar5 != (rrb<char,_false,_6> *)0x0) {
          uVar8 = 0;
          do {
            ptVar4 = (prVar5->root).ptr;
            if (ptVar4 == (tree_node<char,_false> *)0x0) goto LAB_00155ac8;
            if (ptVar4->len <= uVar8) {
              prVar5 = in->ptr;
              if (prVar5 != (rrb<char,_false,_6> *)0x0) {
                uVar8 = 0;
                goto LAB_001558d3;
              }
              break;
            }
            if (local_58.ptr == (rrb<char,_false,_6> *)0x0) goto LAB_00155ab1;
            *(undefined1 *)((long)&(((local_58.ptr)->tail).ptr)->type + uVar8) =
                 *(undefined1 *)(*(long *)(ptVar4 + 1) + uVar8);
            uVar8 = uVar8 + 1;
            prVar5 = in->ptr;
          } while (prVar5 != (rrb<char,_false,_6> *)0x0);
        }
      }
      else {
        if (0x3f < prVar5->cnt - prVar5->tail_len) goto LAB_001556fe;
        uVar1 = ptVar4->len;
        rVar9.ptr = (rrb<char,_false,_6> *)malloc(0x58);
        (rVar9.ptr)->cnt = 0;
        (rVar9.ptr)->shift = 0x40;
        ((rVar9.ptr)->tail).ptr = (leaf_node<char,_false> *)&(rVar9.ptr)->root;
        *(undefined4 *)&(rVar9.ptr)->field_0xc = 0;
        lVar10 = 0;
        do {
          *(undefined1 *)((long)&(((rVar9.ptr)->tail).ptr)->type + lVar10) = 0;
          lVar10 = lVar10 + 1;
        } while (lVar10 != 0x40);
        (rVar9.ptr)->tail_len = 1;
        local_40 = (rrb<char,_false,_6> *)this;
        if (in->ptr != (rrb<char,_false,_6> *)0x0) {
          uVar14 = 0x40 - uVar1;
          uVar12 = in->ptr->tail_len;
          uVar8 = (ulong)(uVar12 - uVar14);
          local_58.ptr = (rrb<char,_false,_6> *)malloc(uVar8 + 0x18);
          this = (rrb_details *)local_40;
          uVar12 = uVar12 - uVar14;
          (local_58.ptr)->shift = uVar12;
          (local_58.ptr)->cnt = 0;
          ((local_58.ptr)->tail).ptr = (leaf_node<char,_false> *)&(local_58.ptr)->root;
          *(undefined4 *)&(local_58.ptr)->field_0xc = 0;
          if (uVar12 != 0) {
            uVar11 = 0;
            do {
              *(undefined1 *)((long)&(((local_58.ptr)->tail).ptr)->type + uVar11) = 0;
              uVar11 = uVar11 + 1;
            } while (uVar8 != uVar11);
          }
          (local_58.ptr)->tail_len = 1;
          prVar5 = in->ptr;
          if (prVar5 != (rrb<char,_false,_6> *)0x0) {
            uVar8 = 0;
            do {
              ptVar4 = (prVar5->root).ptr;
              if (ptVar4 == (tree_node<char,_false> *)0x0) goto LAB_00155ac8;
              if (ptVar4->len <= uVar8) {
                if (uVar1 == 0x40) goto LAB_001559db;
                uVar8 = 0;
                goto LAB_0015599a;
              }
              *(undefined1 *)((long)&(((rVar9.ptr)->tail).ptr)->type + uVar8) =
                   *(undefined1 *)(*(long *)(ptVar4 + 1) + uVar8);
              uVar8 = uVar8 + 1;
              prVar5 = in->ptr;
            } while (prVar5 != (rrb<char,_false,_6> *)0x0);
          }
        }
      }
    }
  }
  goto LAB_00155a27;
  while( true ) {
    plVar3 = (prVar5->tail).ptr;
    if (plVar3 == (leaf_node<char,_false> *)0x0) goto LAB_00155ab1;
    ptVar4 = (prVar5->root).ptr;
    if (ptVar4 == (tree_node<char,_false> *)0x0) goto LAB_00155ac8;
    *(char *)((long)&(((rVar9.ptr)->tail).ptr)->type + (ulong)(ptVar4->len + (int)uVar8)) =
         plVar3->child[uVar8];
    uVar8 = uVar8 + 1;
    if (uVar14 == uVar8) break;
LAB_0015599a:
    prVar5 = in->ptr;
    if (prVar5 == (rrb<char,_false,_6> *)0x0) goto LAB_00155a27;
  }
LAB_001559db:
  prVar5 = in->ptr;
  if (prVar5 != (rrb<char,_false,_6> *)0x0) {
    uVar8 = 0;
    do {
      uVar13 = prVar5->tail_len - uVar14;
      if (uVar13 <= uVar8) {
        prVar5->tail_len = uVar13;
        ref<immutable::rrb_details::leaf_node<char,_false>_>::operator=
                  (&prVar5->tail,(ref<immutable::rrb_details::leaf_node<char,_false>_> *)&local_58);
        prVar5 = in->ptr;
        if (prVar5 != (rrb<char,_false,_6> *)0x0) {
          (rVar9.ptr)->tail_len = (rVar9.ptr)->tail_len + 1;
          local_50.ptr = (rrb<char,_false,_6> *)(prVar5->root).ptr;
          (prVar5->root).ptr = (tree_node<char,_false> *)rVar9.ptr;
          ref<immutable::rrb_details::tree_node<char,_false>_>::~ref
                    ((ref<immutable::rrb_details::tree_node<char,_false>_> *)&local_50);
          if ((local_58.ptr != (rrb<char,_false,_6> *)0x0) &&
             (uVar1 = (local_58.ptr)->tail_len, (local_58.ptr)->tail_len = uVar1 - 1, uVar1 == 1)) {
            free(local_58.ptr);
          }
          uVar1 = (rVar9.ptr)->tail_len;
          (rVar9.ptr)->tail_len = uVar1 - 1;
          goto joined_r0x00155a9e;
        }
        break;
      }
      plVar3 = (prVar5->tail).ptr;
      if ((plVar3 == (leaf_node<char,_false> *)0x0) || (local_58.ptr == (rrb<char,_false,_6> *)0x0))
      goto LAB_00155ab1;
      *(char *)((long)&(((local_58.ptr)->tail).ptr)->type + uVar8) =
           plVar3->child[uVar14 + (int)uVar8];
      uVar8 = uVar8 + 1;
      prVar5 = in->ptr;
    } while (prVar5 != (rrb<char,_false,_6> *)0x0);
  }
  goto LAB_00155a27;
LAB_00155ac8:
  __function = 
  "T *immutable::ref<immutable::rrb_details::tree_node<char, false>>::operator->() const [T = immutable::rrb_details::tree_node<char, false>]"
  ;
  goto LAB_00155add;
LAB_00155ab1:
  __function = 
  "T *immutable::ref<immutable::rrb_details::leaf_node<char, false>>::operator->() const [T = immutable::rrb_details::leaf_node<char, false>]"
  ;
  goto LAB_00155add;
  while( true ) {
    plVar3 = (prVar5->tail).ptr;
    if ((plVar3 == (leaf_node<char,_false> *)0x0) || (local_58.ptr == (rrb<char,_false,_6> *)0x0))
    goto LAB_00155ab1;
    ptVar4 = (prVar5->root).ptr;
    if (ptVar4 == (tree_node<char,_false> *)0x0) goto LAB_00155ac8;
    *(char *)((long)&(((local_58.ptr)->tail).ptr)->type + (ulong)(ptVar4->len + (int)uVar8)) =
         plVar3->child[uVar8];
    uVar8 = uVar8 + 1;
    prVar5 = in->ptr;
    if (prVar5 == (rrb<char,_false,_6> *)0x0) break;
LAB_001558d3:
    if (prVar5->tail_len <= uVar8) {
      prVar5->tail_len = prVar5->cnt;
      local_38.ptr = (tree_node<char,_false> *)0x0;
      local_50.ptr = (rrb<char,_false,_6> *)(prVar5->root).ptr;
      (prVar5->root).ptr = (tree_node<char,_false> *)0x0;
      ref<immutable::rrb_details::tree_node<char,_false>_>::~ref
                ((ref<immutable::rrb_details::tree_node<char,_false>_> *)&local_50);
      ref<immutable::rrb_details::tree_node<char,_false>_>::~ref(&local_38);
      if (in->ptr != (rrb<char,_false,_6> *)0x0) {
        ref<immutable::rrb_details::leaf_node<char,_false>_>::operator=
                  (&in->ptr->tail,(ref<immutable::rrb_details::leaf_node<char,_false>_> *)&local_58)
        ;
        if (local_58.ptr != (rrb<char,_false,_6> *)0x0) {
          uVar1 = (local_58.ptr)->tail_len;
          (local_58.ptr)->tail_len = uVar1 - 1;
          rVar9.ptr = local_58.ptr;
joined_r0x00155a9e:
          if (uVar1 == 1) {
            free(rVar9.ptr);
          }
        }
        goto LAB_001556fe;
      }
      break;
    }
  }
LAB_00155a27:
  __function = 
  "T *immutable::ref<immutable::rrb<char, false, 6>>::operator->() const [T = immutable::rrb<char, false, 6>]"
  ;
LAB_00155add:
  __assert_fail("ptr != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/../immutable/rrb.h"
                ,0x71a,__function);
}

Assistant:

T* ref<T>::operator->() const
      {
      assert(ptr != nullptr);
      return ptr;
      }